

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UChar32 u_charFromName_63(UCharNameChoice nameChoice,char *name,UErrorCode *pErrorCode)

{
  undefined1 c;
  UBool UVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  UChar32 UVar5;
  int *piVar6;
  bool bVar7;
  uint local_14c;
  uint32_t cIdx;
  UChar32 error;
  uint uStack_13c;
  char c0;
  UChar32 cp;
  uint32_t i;
  uint32_t *p;
  AlgorithmicRange *algRange;
  FindName findName;
  char lower [120];
  undefined1 local_98 [8];
  char upper [120];
  UErrorCode *pErrorCode_local;
  char *name_local;
  UCharNameChoice nameChoice_local;
  
  error = 0;
  if ((pErrorCode == (UErrorCode *)0x0) ||
     (upper._112_8_ = pErrorCode, UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    name_local._4_4_ = 0xffff;
  }
  else if ((((int)nameChoice < 4) && (name != (char *)0x0)) && (*name != '\0')) {
    UVar1 = icu_63::isDataLoaded((UErrorCode *)upper._112_8_);
    if (UVar1 == '\0') {
      name_local._4_4_ = 0xffff;
    }
    else {
      pErrorCode_local = (UErrorCode *)name;
      for (uStack_13c = 0; uStack_13c < 0x78; uStack_13c = uStack_13c + 1) {
        c = (undefined1)*pErrorCode_local;
        if (c == U_ZERO_ERROR) {
          lower[(ulong)uStack_13c - 8] = '\0';
          local_98[uStack_13c] = 0;
          break;
        }
        cVar2 = uprv_toupper_63(c);
        local_98[uStack_13c] = cVar2;
        cVar2 = uprv_asciitolower_63(c);
        lower[(ulong)uStack_13c - 8] = cVar2;
        pErrorCode_local = (UErrorCode *)((long)pErrorCode_local + 1);
      }
      if (uStack_13c == 0x78) {
        *(undefined4 *)upper._112_8_ = 0xc;
        name_local._4_4_ = 0xffff;
      }
      else if ((char)findName.code == '<') {
        if (((nameChoice == U_EXTENDED_CHAR_NAME) && (lower[(ulong)(uStack_13c - 1) - 8] == '>')) &&
           ((2 < uStack_13c - 1 &&
            (uStack_13c = uStack_13c - 2, lower[(ulong)uStack_13c - 8] != '-')))) {
          do {
            bVar7 = false;
            if (2 < uStack_13c) {
              uStack_13c = uStack_13c - 1;
              bVar7 = lower[(ulong)uStack_13c - 8] != '-';
            }
          } while (bVar7);
          if ((1 < uStack_13c) && (lower[(ulong)uStack_13c - 8] == '-')) {
            lower[(ulong)uStack_13c - 8] = '\0';
            while (uStack_13c = uStack_13c + 1, lower[(ulong)uStack_13c - 8] != '>') {
              if ((lower[(ulong)uStack_13c - 8] < '0') || ('9' < lower[(ulong)uStack_13c - 8])) {
                if ((lower[(ulong)uStack_13c - 8] < 'a') || ('f' < lower[(ulong)uStack_13c - 8])) {
                  *(undefined4 *)upper._112_8_ = 0xc;
                  return 0xffff;
                }
                error = error * 0x10 + (int)lower[(ulong)uStack_13c - 8] + -0x57;
              }
              else {
                error = error * 0x10 + (int)lower[(ulong)uStack_13c - 8] + -0x30;
              }
            }
            lower[(ulong)uStack_13c - 8] = '\0';
            for (local_14c = 0; local_14c < 0x21; local_14c = local_14c + 1) {
              iVar4 = strcmp((char *)((long)&findName.code + 1),
                             *(char **)(icu_63::charCatNames + (ulong)local_14c * 8));
              if (iVar4 == 0) {
                bVar3 = icu_63::getCharCat(error);
                if (bVar3 == local_14c) {
                  return error;
                }
                break;
              }
            }
          }
        }
        *(undefined4 *)upper._112_8_ = 0xc;
        name_local._4_4_ = 0xffff;
      }
      else {
        piVar6 = (int *)((long)&icu_63::uCharNames->tokenStringOffset +
                        (ulong)icu_63::uCharNames->algNamesOffset);
        p = (uint32_t *)(piVar6 + 1);
        for (uStack_13c = *piVar6; uStack_13c != 0; uStack_13c = uStack_13c + -1) {
          UVar5 = icu_63::findAlgName((AlgorithmicRange *)p,nameChoice,local_98);
          if (UVar5 != 0xffff) {
            return UVar5;
          }
          p = (uint32_t *)((long)p + (long)(int)(uint)*(ushort *)((long)p + 10));
        }
        algRange = (AlgorithmicRange *)local_98;
        findName.otherName._0_4_ = 0xffff;
        icu_63::enumNames(icu_63::uCharNames,0,0x110000,(UEnumCharNamesFn *)0x0,&algRange,nameChoice
                         );
        if ((int)findName.otherName == 0xffff) {
          *(undefined4 *)upper._112_8_ = 0xc;
        }
        name_local._4_4_ = (int)findName.otherName;
      }
    }
  }
  else {
    *(undefined4 *)upper._112_8_ = 1;
    name_local._4_4_ = 0xffff;
  }
  return name_local._4_4_;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
u_charFromName(UCharNameChoice nameChoice,
               const char *name,
               UErrorCode *pErrorCode) {
    char upper[120], lower[120];
    FindName findName;
    AlgorithmicRange *algRange;
    uint32_t *p;
    uint32_t i;
    UChar32 cp = 0;
    char c0;
    UChar32 error = 0xffff;     /* Undefined, but use this for backwards compatibility. */

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return error;
    }

    if(nameChoice>=U_CHAR_NAME_CHOICE_COUNT || name==NULL || *name==0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return error;
    }

    if(!isDataLoaded(pErrorCode)) {
        return error;
    }

    /* construct the uppercase and lowercase of the name first */
    for(i=0; i<sizeof(upper); ++i) {
        if((c0=*name++)!=0) {
            upper[i]=uprv_toupper(c0);
            lower[i]=uprv_tolower(c0);
        } else {
            upper[i]=lower[i]=0;
            break;
        }
    }
    if(i==sizeof(upper)) {
        /* name too long, there is no such character */
        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }
    // i==strlen(name)==strlen(lower)==strlen(upper)

    /* try extended names first */
    if (lower[0] == '<') {
        if (nameChoice == U_EXTENDED_CHAR_NAME) {
            // Parse a string like "<category-HHHH>" where HHHH is a hex code point.
            if (lower[--i] == '>' && i >= 3 && lower[--i] != '-') {
                while (i >= 3 && lower[--i] != '-') {}

                if (i >= 2 && lower[i] == '-') {
                    uint32_t cIdx;

                    lower[i] = 0;

                    for (++i; lower[i] != '>'; ++i) {
                        if (lower[i] >= '0' && lower[i] <= '9') {
                            cp = (cp << 4) + lower[i] - '0';
                        } else if (lower[i] >= 'a' && lower[i] <= 'f') {
                            cp = (cp << 4) + lower[i] - 'a' + 10;
                        } else {
                            *pErrorCode = U_ILLEGAL_CHAR_FOUND;
                            return error;
                        }
                    }

                    /* Now validate the category name.
                       We could use a binary search, or a trie, if
                       we really wanted to. */

                    for (lower[i] = 0, cIdx = 0; cIdx < UPRV_LENGTHOF(charCatNames); ++cIdx) {

                        if (!uprv_strcmp(lower + 1, charCatNames[cIdx])) {
                            if (getCharCat(cp) == cIdx) {
                                return cp;
                            }
                            break;
                        }
                    }
                }
            }
        }

        *pErrorCode = U_ILLEGAL_CHAR_FOUND;
        return error;
    }

    /* try algorithmic names now */
    p=(uint32_t *)((uint8_t *)uCharNames+uCharNames->algNamesOffset);
    i=*p;
    algRange=(AlgorithmicRange *)(p+1);
    while(i>0) {
        if((cp=findAlgName(algRange, nameChoice, upper))!=0xffff) {
            return cp;
        }
        algRange=(AlgorithmicRange *)((uint8_t *)algRange+algRange->size);
        --i;
    }

    /* normal character name */
    findName.otherName=upper;
    findName.code=error;
    enumNames(uCharNames, 0, UCHAR_MAX_VALUE + 1, DO_FIND_NAME, &findName, nameChoice);
    if (findName.code == error) {
         *pErrorCode = U_ILLEGAL_CHAR_FOUND;
    }
    return findName.code;
}